

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O3

void __thiscall
ThreeWiseHash<unsigned_long_long,_unsigned_char>::ThreeWiseHash
          (ThreeWiseHash<unsigned_long_long,_unsigned_char> *this,int myn,int mywordsize)

{
  pointer *ppCVar1;
  iterator __position;
  unsigned_long_long maxval;
  ostream *poVar2;
  undefined8 *puVar3;
  int iVar4;
  CharacterHash<unsigned_long_long,_unsigned_char> ch;
  CharacterHash<unsigned_long_long,_unsigned_char> CStack_828;
  
  this->n = myn;
  this->wordsize = mywordsize;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map
            (&(this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>,0);
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash(&this->hasher,0);
  if ((uint)this->wordsize < 0x41) {
    if (0 < this->n) {
      iVar4 = 0;
      do {
        maxval = maskfnc<unsigned_long_long>(this->wordsize);
        CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash(&CStack_828,maxval);
        __position._M_current =
             (this->hashers).
             super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->hashers).
            super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<CharacterHash<unsigned_long_long,unsigned_char>,std::allocator<CharacterHash<unsigned_long_long,unsigned_char>>>
          ::_M_realloc_insert<CharacterHash<unsigned_long_long,unsigned_char>const&>
                    ((vector<CharacterHash<unsigned_long_long,unsigned_char>,std::allocator<CharacterHash<unsigned_long_long,unsigned_char>>>
                      *)&this->hashers,__position,&CStack_828);
        }
        else {
          memcpy(__position._M_current,&CStack_828,0x800);
          ppCVar1 = &(this->hashers).
                     super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->n);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Can\'t create ",0xd);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->wordsize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-bit hash values",0x10);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "abord";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

ThreeWiseHash(int myn, int mywordsize = 19)
      : n(myn), wordsize(mywordsize), hashers(), hasher(0) {
    if (static_cast<uint>(wordsize) > 8 * sizeof(hashvaluetype)) {
      cerr << "Can't create " << wordsize << "-bit hash values" << endl;
      throw "abord";
    }
    for (int i = 0; i < n; ++i) {
      CharacterHash<hashvaluetype, chartype> ch(
          maskfnc<hashvaluetype>(wordsize));
      hashers.push_back(ch);
    }
  }